

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtin.c
# Opt level: O0

int expand_expect(dmr_C *C,expression *expr,int cost)

{
  expression *__src;
  expression *arg;
  int cost_local;
  expression *expr_local;
  dmr_C *C_local;
  
  __src = dmrC_first_expression((expr->field_5).field_11.args);
  if (__src != (expression *)0x0) {
    memcpy(expr,__src,0x40);
  }
  return 0;
}

Assistant:

static int expand_expect(struct dmr_C *C, struct expression *expr, int cost)
{
	struct expression *arg = dmrC_first_expression(expr->args);
	(void)C;
	(void)cost;

	if (arg)
		*expr = *arg;
	return 0;
}